

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_26UL> *param_5)

{
  CappedArray<char,_5UL> CVar1;
  size_t local_60;
  undefined4 local_58;
  char local_54;
  CappedArray<char,_26UL> local_50;
  
  CVar1 = tryToCharSequence<unsigned_char,kj::CappedArray<char,5ul>>((uchar *)*param_2);
  local_60 = CVar1.currentSize;
  local_58 = CVar1.content._0_4_;
  local_54 = CVar1.content[4];
  toCharSequence<unsigned_long&>
            (&local_50,(kj *)(param_2 + 1),(unsigned_long *)(CVar1._8_8_ >> 0x20));
  concat<kj::CappedArray<char,5ul>,kj::StringPtr&,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_60,(CappedArray<char,_5UL> *)(param_2 + 2),
             (StringPtr *)&local_50,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}